

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall
args::
ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
::ValueFlag(ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
            *this,Group *group_,string *name_,string *help_,Matcher *matcher_,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue_,
           Options options_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *defaultValue__local;
  Matcher *matcher__local;
  string *help__local;
  string *name__local;
  Group *group__local;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  *this_local;
  
  ValueFlagBase::ValueFlagBase(&this->super_ValueFlagBase,name_,help_,matcher_,options_);
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlag_00142a58;
  std::__cxx11::string::string((string *)&this->value,(string *)defaultValue_);
  std::__cxx11::string::string((string *)&this->defaultValue,(string *)defaultValue_);
  Group::Add(group_,(Base *)this);
  return;
}

Assistant:

ValueFlag(Group &group_, const std::string &name_, const std::string &help_, Matcher &&matcher_, const T &defaultValue_, Options options_): ValueFlagBase(name_, help_, std::move(matcher_), options_), value(defaultValue_), defaultValue(defaultValue_)
            {
                group_.Add(*this);
            }